

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O2

size_t __thiscall
webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>::addBuffer
          (Frame<webfront::networking::TCPNetworkingTS> *this,
          span<const_std::byte,_18446744073709551615UL> buffer)

{
  uint64_t uVar1;
  string_view fmt;
  debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_49;
  span<const_std::byte,_18446744073709551615UL> buffer_local;
  srcLoc local_38;
  string local_30;
  
  buffer_local._M_extent = buffer._M_extent._M_extent_value;
  buffer_local._M_ptr = buffer._M_ptr;
  utils::hexDump<std::span<const_std::byte,_18446744073709551615UL>_>
            (&local_30,&buffer_local,buffer_local._M_extent._M_extent_value);
  local_38._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00199608;
  fmt._M_str = "frame::addBuffer {}";
  fmt._M_len = 0x13;
  log::debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  debug(&local_49,fmt,&local_30,&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  uVar1 = Header::payloadSize(&this->super_Header);
  Header::setPayloadSize(&this->super_Header,uVar1 + buffer_local._M_extent._M_extent_value);
  local_30._M_dataplus._M_p = (pointer)buffer_local._M_ptr;
  local_38._M_impl = (__impl *)buffer_local._M_extent._M_extent_value;
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte_const*,unsigned_long>
            ((vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
              *)&this->buffers,(byte **)&local_30,(unsigned_long *)&local_38);
  return buffer_local._M_extent._M_extent_value;
}

Assistant:

size_t addBuffer(std::span<const std::byte> buffer) {
        log::debug("frame::addBuffer {}", utils::hexDump(buffer));
        setPayloadSize(payloadSize() + buffer.size());
        buffers.emplace_back(buffer.data(), buffer.size());
        return buffer.size();
    }